

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

XMLAttDef * __thiscall
xercesc_4_0::DTDScanner::scanAttDef(DTDScanner *this,DTDElementDecl *parentElem,XMLBuffer *bufToUse)

{
  short *psVar1;
  short sVar2;
  char16_t cVar3;
  char16_t cVar4;
  uint uVar5;
  DefAttTypes DVar6;
  ReaderMgr *pRVar7;
  XMLScanner *pXVar8;
  DTDAttDef *pDVar9;
  XMLValidator *this_00;
  XMLReader *this_01;
  DocTypeHandler *pDVar10;
  bool bVar11;
  int iVar12;
  DTDAttDef *pDVar13;
  XMLCh *text2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BaseRefVectorOf<char16_t> *this_02;
  char16_t *pcVar14;
  undefined4 extraout_var_01;
  XMLCh *pXVar15;
  long lVar16;
  char16_t *pcVar17;
  char16_t *pcVar18;
  XMLCh fgDefault [8];
  XMLCh fgPreserve [9];
  wchar16 local_58 [20];
  
  checkForPERef(this,false,true);
  pRVar7 = this->fReaderMgr;
  bufToUse->fIndex = 0;
  bVar11 = XMLReader::getName(pRVar7->fCurReader,bufToUse,false);
  if (!bVar11) {
    XMLScanner::emitError(this->fScanner,ExpectedAttrName);
    return (XMLAttDef *)0x0;
  }
  pXVar15 = bufToUse->fBuffer;
  pXVar15[bufToUse->fIndex] = L'\0';
  pDVar13 = DTDElementDecl::getAttDef(parentElem,pXVar15);
  if (pDVar13 == (DTDAttDef *)0x0) {
    pDVar13 = (DTDAttDef *)XMemory::operator_new(0x48,this->fGrammarPoolMemoryManager);
    pXVar15 = bufToUse->fBuffer;
    pXVar15[bufToUse->fIndex] = L'\0';
    DTDAttDef::DTDAttDef(pDVar13,pXVar15,AttTypes_Min,Implied,this->fGrammarPoolMemoryManager);
    uVar5 = this->fNextAttrId;
    this->fNextAttrId = uVar5 + 1;
    (pDVar13->super_XMLAttDef).fId = (ulong)uVar5;
    (pDVar13->super_XMLAttDef).fExternalAttribute =
         this->fDocTypeReaderId != this->fReaderMgr->fCurReader->fReaderNum;
    DTDElementDecl::addAttDef(parentElem,pDVar13);
  }
  else {
    pXVar8 = this->fScanner;
    pXVar15 = bufToUse->fBuffer;
    pXVar15[bufToUse->fIndex] = L'\0';
    text2 = QName::getRawName((parentElem->super_XMLElementDecl).fElementName);
    XMLScanner::emitError(pXVar8,AttListAlreadyExists,pXVar15,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    if (this->fDumAttDef == (DTDAttDef *)0x0) {
      pDVar13 = (DTDAttDef *)XMemory::operator_new(0x48,this->fMemoryManager);
      DTDAttDef::DTDAttDef(pDVar13,this->fMemoryManager);
      this->fDumAttDef = pDVar13;
      uVar5 = this->fNextAttrId;
      this->fNextAttrId = uVar5 + 1;
      (pDVar13->super_XMLAttDef).fId = (ulong)uVar5;
    }
    pDVar13 = this->fDumAttDef;
    pXVar15 = bufToUse->fBuffer;
    pXVar15[bufToUse->fIndex] = L'\0';
    DTDAttDef::setName(pDVar13,pXVar15);
    pDVar13 = this->fDumAttDef;
  }
  pDVar9 = this->fDumAttDef;
  bVar11 = checkForPERef(this,false,true);
  if (!bVar11) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar11 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgCDATAString);
  if (bVar11) {
    (pDVar13->super_XMLAttDef).fType = AttTypes_Min;
  }
  else {
    bVar11 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"ID");
    this_01 = this->fReaderMgr->fCurReader;
    if (bVar11) {
      bVar11 = XMLReader::skippedString(this_01,L"REF");
      if (bVar11) {
        bVar11 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
        if (bVar11) {
          (pDVar13->super_XMLAttDef).fType = IDRefs;
        }
        else {
          (pDVar13->super_XMLAttDef).fType = IDRef;
        }
      }
      else {
        (pDVar13->super_XMLAttDef).fType = ID;
      }
    }
    else {
      bVar11 = XMLReader::skippedString(this_01,(XMLCh *)XMLUni::fgEntitString);
      if (bVar11) {
        bVar11 = ReaderMgr::skippedChar(this->fReaderMgr,L'Y');
        if (bVar11) {
          (pDVar13->super_XMLAttDef).fType = Entity;
        }
        else {
          bVar11 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"IES");
          if (!bVar11) {
LAB_0030a477:
            pXVar8 = this->fScanner;
            iVar12 = (*(pDVar13->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                               (pDVar13);
            pXVar15 = QName::getRawName((parentElem->super_XMLElementDecl).fElementName);
            XMLScanner::emitError
                      (pXVar8,ExpectedAttributeType,(XMLCh *)CONCAT44(extraout_var_01,iVar12),
                       pXVar15,(XMLCh *)0x0,(XMLCh *)0x0);
            return (XMLAttDef *)0x0;
          }
          (pDVar13->super_XMLAttDef).fType = Entities;
        }
      }
      else {
        bVar11 = XMLReader::skippedString
                           (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNmTokenString);
        if (bVar11) {
          bVar11 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
          if (bVar11) {
            (pDVar13->super_XMLAttDef).fType = NmTokens;
          }
          else {
            (pDVar13->super_XMLAttDef).fType = NmToken;
          }
        }
        else {
          bVar11 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"NOTATION");
          if (bVar11) {
            bVar11 = checkForPERef(this,false,true);
            if (!bVar11) {
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
            }
            (pDVar13->super_XMLAttDef).fType = Notation;
            bVar11 = true;
          }
          else {
            bVar11 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
            if (!bVar11) goto LAB_0030a477;
            (pDVar13->super_XMLAttDef).fType = Enumeration;
            bVar11 = false;
          }
          bVar11 = scanEnumeration(this,pDVar13,bufToUse,bVar11);
          if (!bVar11) {
            return (XMLAttDef *)0x0;
          }
          pXVar15 = bufToUse->fBuffer;
          pXVar15[bufToUse->fIndex] = L'\0';
          XMLAttDef::setEnumeration(&pDVar13->super_XMLAttDef,pXVar15);
        }
      }
    }
  }
  bVar11 = checkForPERef(this,false,true);
  if (!bVar11) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  scanDefaultDecl(this,pDVar13);
  if (this->fScanner->fValScheme == Val_Always) {
    if ((((pDVar13->super_XMLAttDef).fType == ID) &&
        (DVar6 = (pDVar13->super_XMLAttDef).fDefaultType, DVar6 != Required)) && (DVar6 != Implied))
    {
      this_00 = this->fScanner->fValidator;
      iVar12 = (*(pDVar13->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(pDVar13);
      XMLValidator::emitError
                (this_00,BadIDAttrDefType,(XMLCh *)CONCAT44(extraout_var,iVar12),(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    iVar12 = (*(pDVar13->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(pDVar13);
    if (CONCAT44(extraout_var_00,iVar12) != 0) {
      lVar16 = 0;
      do {
        sVar2 = *(short *)(CONCAT44(extraout_var_00,iVar12) + lVar16);
        if (sVar2 == 0) {
          if (*(short *)((long)&DAT_00370bf0 + lVar16) == 0) {
            builtin_memcpy(local_58 + 8,L"preserve",0x12);
            builtin_memcpy(local_58,L"default",0x10);
            if ((pDVar13->super_XMLAttDef).fType != Enumeration) goto LAB_0030a570;
            this_02 = XMLString::tokenizeString
                                ((pDVar13->super_XMLAttDef).fEnumeration,this->fMemoryManager);
            if (this_02->fCurCount != 2) {
              if (this_02->fCurCount != 1) goto LAB_0030a566;
              pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
              if (pcVar14 == local_58) goto LAB_0030a4d2;
              pcVar17 = local_58;
              pcVar18 = local_58;
              if (pcVar14 != (char16_t *)0x0) goto LAB_0030a334;
              goto LAB_0030a4b1;
            }
            pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
            bVar11 = XMLString::equals(pcVar14,local_58);
            if (bVar11) {
              pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,1);
              bVar11 = XMLString::equals(pcVar14,local_58 + 8);
              if (!bVar11) goto LAB_0030a520;
            }
            else {
LAB_0030a520:
              pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,1);
              bVar11 = XMLString::equals(pcVar14,local_58);
              if (!bVar11) goto LAB_0030a566;
              pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
              bVar11 = XMLString::equals(pcVar14,local_58 + 8);
            }
            (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
            if (bVar11 == false) goto LAB_0030a570;
          }
          break;
        }
        psVar1 = (short *)((long)&DAT_00370bf0 + lVar16);
        lVar16 = lVar16 + 2;
      } while (sVar2 == *psVar1);
    }
  }
  goto LAB_0030a585;
LAB_0030a4b1:
  if (*pcVar18 != L'\0') goto LAB_0030a4b7;
  goto LAB_0030a4d2;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    cVar4 = *pcVar17;
    pcVar17 = pcVar17 + 1;
    if (cVar3 != cVar4) break;
LAB_0030a334:
    cVar3 = *pcVar14;
    pcVar18 = pcVar17;
    if (cVar3 == L'\0') goto LAB_0030a4b1;
  }
LAB_0030a4b7:
  pcVar14 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
  bVar11 = XMLString::equals(pcVar14,local_58 + 8);
  if (!bVar11) {
LAB_0030a566:
    (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
LAB_0030a570:
    XMLValidator::emitError(this->fScanner->fValidator,IllegalXMLSpace);
    goto LAB_0030a585;
  }
LAB_0030a4d2:
  (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
LAB_0030a585:
  pDVar10 = this->fDocTypeHandler;
  if (pDVar10 != (DocTypeHandler *)0x0) {
    (*pDVar10->_vptr_DocTypeHandler[2])(pDVar10,parentElem,pDVar13,(ulong)(pDVar13 == pDVar9));
  }
  return &pDVar13->super_XMLAttDef;
}

Assistant:

XMLAttDef*
DTDScanner::scanAttDef(DTDElementDecl& parentElem, XMLBuffer& bufToUse)
{
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    // Get the name of the attribute
    if (!fReaderMgr->getName(bufToUse))
    {
        fScanner->emitError(XMLErrs::ExpectedAttrName);
        return 0;
    }

    //
    //  Look up this attribute in the parent element's attribute list. If
    //  it already exists, then use the dummy.
    //
    DTDAttDef* decl = parentElem.getAttDef(bufToUse.getRawBuffer());
    if (decl)
    {
        // It already exists, so put out a warning
        fScanner->emitError
        (
            XMLErrs::AttListAlreadyExists
            , bufToUse.getRawBuffer()
            , parentElem.getFullName()
        );

        // Use the dummy decl to parse into and set its name to the name we got
        if (!fDumAttDef)
        {
            fDumAttDef = new (fMemoryManager) DTDAttDef(fMemoryManager);
            fDumAttDef->setId(fNextAttrId++);
        }
        fDumAttDef->setName(bufToUse.getRawBuffer());
        decl = fDumAttDef;
    }
     else
    {
        //
        //  It does not already exist so create a new one, give it the next
        //  available unique id, and add it
        //
        decl = new (fGrammarPoolMemoryManager) DTDAttDef
        (
            bufToUse.getRawBuffer()
            , XMLAttDef::CData
            , XMLAttDef::Implied
            , fGrammarPoolMemoryManager
        );
        decl->setId(fNextAttrId++);
        decl->setExternalAttDeclaration(isReadingExternalEntity());
        parentElem.addAttDef(decl);
    }

    // Set a flag to indicate whether we are doing a dummy parse
    const bool isIgnored = (decl == fDumAttDef);

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    //
    //  Next has to be one of the attribute type strings. This tells us what
    //  is to follow.
    //
    if (fReaderMgr->skippedString(XMLUni::fgCDATAString))
    {
        decl->setType(XMLAttDef::CData);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgIDString))
    {
        if (!fReaderMgr->skippedString(XMLUni::fgRefString))
            decl->setType(XMLAttDef::ID);
        else if (!fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::IDRef);
        else
            decl->setType(XMLAttDef::IDRefs);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgEntitString))
    {
        if (fReaderMgr->skippedChar(chLatin_Y))
        {
            decl->setType(XMLAttDef::Entity);
        }
         else if (fReaderMgr->skippedString(XMLUni::fgIESString))
        {
            decl->setType(XMLAttDef::Entities);
        }
         else
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedAttributeType
                , decl->getFullName()
                , parentElem.getFullName()
            );
            return 0;
        }
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNmTokenString))
    {
        if (fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::NmTokens);
        else
            decl->setType(XMLAttDef::NmToken);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
    {
        // Check for PE ref and require space
        if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);

        decl->setType(XMLAttDef::Notation);
        if (!scanEnumeration(*decl, bufToUse, true))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else if (fReaderMgr->skippedChar(chOpenParen))
    {
        decl->setType(XMLAttDef::Enumeration);
        if (!scanEnumeration(*decl, bufToUse, false))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else
    {
        fScanner->emitError
        (
            XMLErrs::ExpectedAttributeType
            , decl->getFullName()
            , parentElem.getFullName()
        );
        return 0;
    }

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And then scan for the optional default value declaration
    scanDefaultDecl(*decl);

    // If validating, then do a couple of validation constraints
    if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
    {
        if (decl->getType() == XMLAttDef::ID)
        {
            if ((decl->getDefaultType() != XMLAttDef::Implied)
            &&  (decl->getDefaultType() != XMLAttDef::Required))
            {
                fScanner->getValidator()->emitError(XMLValid::BadIDAttrDefType, decl->getFullName());
            }
        }

        // if attdef is xml:space, check correct enumeration (default|preserve)
        const XMLCh fgXMLSpace[] = { chLatin_x, chLatin_m, chLatin_l, chColon, chLatin_s, chLatin_p, chLatin_a, chLatin_c, chLatin_e, chNull };

        if (XMLString::equals(decl->getFullName(),fgXMLSpace)) {
            const XMLCh fgPreserve[] = { chLatin_p, chLatin_r, chLatin_e, chLatin_s, chLatin_e, chLatin_r, chLatin_v, chLatin_e, chNull };
            const XMLCh fgDefault[] = { chLatin_d, chLatin_e, chLatin_f, chLatin_a, chLatin_u, chLatin_l, chLatin_t, chNull };
            bool ok = false;
            if (decl->getType() == XMLAttDef::Enumeration) {
                BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(decl->getEnumeration(), fMemoryManager);
                XMLSize_t size = enumVector->size();
                ok = (size == 1 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) ||
                      XMLString::equals(enumVector->elementAt(0), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(1), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(1), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(0), fgPreserve)));
                delete enumVector;
            }
            if (!ok)
                fScanner->getValidator()->emitError(XMLValid::IllegalXMLSpace);
        }
    }

    // If we have a doc type handler, tell it about this attdef.
    if (fDocTypeHandler)
        fDocTypeHandler->attDef(parentElem, *decl, isIgnored);
    return decl;
}